

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O3

aom_codec_err_t
decoder_inspect(aom_codec_alg_priv_t *ctx,uint8_t *data,size_t data_sz,void *user_priv)

{
  long *plVar1;
  AV1Decoder *pbi;
  RefCntBuffer *pRVar2;
  int iVar3;
  aom_codec_err_t aVar4;
  AVxWorker *pAVar5;
  uint8_t *puVar6;
  char *pcVar7;
  long lVar8;
  uint8_t *puVar9;
  size_t length_of_size;
  uint64_t frame_size;
  uint64_t temporal_unit_size;
  uint8_t *local_50;
  size_t local_48;
  ulong local_40;
  ulong local_38;
  
  release_pending_output_frames(ctx);
  if (data == (uint8_t *)0x0 && data_sz == 0) {
    ctx->flushed = 1;
  }
  else {
    if (data == (uint8_t *)0x0 || data_sz == 0) {
      return AOM_CODEC_INVALID_PARAM;
    }
    ctx->flushed = 0;
    local_50 = data;
    if (ctx->is_annexb == 0) {
      puVar9 = data + data_sz;
      local_40 = data_sz;
    }
    else {
      iVar3 = aom_uleb_decode(data,data_sz,&local_38,&local_48);
      if ((iVar3 != 0) || (data_sz - local_48 < local_38)) {
        return AOM_CODEC_CORRUPT_FRAME;
      }
      puVar9 = data + local_48;
      iVar3 = aom_uleb_decode(puVar9,local_38,&local_40,&local_48);
      if (iVar3 != 0) {
        return AOM_CODEC_CORRUPT_FRAME;
      }
      local_50 = puVar9 + local_48;
      if (local_38 - local_48 < local_40) {
        return AOM_CODEC_CORRUPT_FRAME;
      }
      puVar9 = puVar9 + local_38;
    }
    pAVar5 = ctx->frame_worker;
    if (pAVar5 == (AVxWorker *)0x0) {
      aVar4 = init_decoder(ctx);
      if (aVar4 != AOM_CODEC_OK) {
        return aVar4;
      }
      pAVar5 = ctx->frame_worker;
    }
    plVar1 = (long *)pAVar5->data1;
    pbi = (AV1Decoder *)*plVar1;
    aVar4 = av1_receive_compressed_data(pbi,local_40,&local_50);
    lVar8 = *plVar1;
    if (((ctx->need_resync == 1) && (*(int *)(lVar8 + 0x58d90) == 0)) &&
       ((*(byte *)(lVar8 + 0x3b60) & 0xfd) == 0)) {
      ctx->need_resync = 0;
    }
    if (ctx->frame_worker->had_error == 0) {
      puVar6 = local_50;
      if (local_50 < puVar9) {
        do {
          puVar6 = local_50;
          if (*local_50 != '\0') break;
          local_50 = local_50 + 1;
          puVar6 = puVar9;
        } while (local_50 != puVar9);
      }
      *(undefined4 *)((long)user_priv + 8) = 0xffffffff;
      pRVar2 = (pbi->common).cur_frame;
      if (pRVar2 != (RefCntBuffer *)0x0) {
        lVar8 = 0;
        do {
          if ((pbi->common).ref_frame_map[lVar8] == pRVar2) {
            *(int *)((long)user_priv + 8) = (int)lVar8;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
      }
      *(uint8_t **)user_priv = puVar6;
      *(int *)((long)user_priv + 0xc) = (pbi->common).show_existing_frame;
      return aVar4;
    }
    aVar4 = *(aom_codec_err_t *)(lVar8 + 0x5ff08);
    if (aVar4 != AOM_CODEC_OK) {
      pcVar7 = (char *)0x0;
      if (*(int *)(lVar8 + 0x5ff0c) != 0) {
        pcVar7 = (char *)(lVar8 + 0x5ff10);
      }
      (ctx->base).err_detail = pcVar7;
      return aVar4;
    }
  }
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t decoder_inspect(aom_codec_alg_priv_t *ctx,
                                       const uint8_t *data, size_t data_sz,
                                       void *user_priv) {
  aom_codec_err_t res = AOM_CODEC_OK;

  release_pending_output_frames(ctx);

  /* Sanity checks */
  /* NULL data ptr allowed if data_sz is 0 too */
  if (data == NULL && data_sz == 0) {
    ctx->flushed = 1;
    return AOM_CODEC_OK;
  }
  if (data == NULL || data_sz == 0) return AOM_CODEC_INVALID_PARAM;

  // Reset flushed when receiving a valid frame.
  ctx->flushed = 0;

  const uint8_t *data_start = data;
  const uint8_t *data_end = data + data_sz;

  uint64_t frame_size;
  if (ctx->is_annexb) {
    // read the size of this temporal unit
    size_t length_of_size;
    uint64_t temporal_unit_size;
    if (aom_uleb_decode(data_start, data_sz, &temporal_unit_size,
                        &length_of_size) != 0) {
      return AOM_CODEC_CORRUPT_FRAME;
    }
    data_start += length_of_size;
    if (temporal_unit_size > (size_t)(data_end - data_start))
      return AOM_CODEC_CORRUPT_FRAME;
    data_end = data_start + temporal_unit_size;

    // read the size of this frame unit
    if (aom_uleb_decode(data_start, (size_t)(data_end - data_start),
                        &frame_size, &length_of_size) != 0) {
      return AOM_CODEC_CORRUPT_FRAME;
    }
    data_start += length_of_size;
    if (frame_size > (size_t)(data_end - data_start))
      return AOM_CODEC_CORRUPT_FRAME;
  } else {
    frame_size = (uint64_t)(data_end - data_start);
  }

  if (ctx->frame_worker == NULL) {
    res = init_decoder(ctx);
    if (res != AOM_CODEC_OK) return res;
  }
  FrameWorkerData *const frame_worker_data =
      (FrameWorkerData *)ctx->frame_worker->data1;
  AV1Decoder *const pbi = frame_worker_data->pbi;
  AV1_COMMON *const cm = &pbi->common;
#if CONFIG_INSPECTION
  frame_worker_data->pbi->inspect_cb = ctx->inspect_cb;
  frame_worker_data->pbi->inspect_ctx = ctx->inspect_ctx;
#endif
  res = av1_receive_compressed_data(frame_worker_data->pbi, (size_t)frame_size,
                                    &data_start);
  check_resync(ctx, frame_worker_data->pbi);

  if (ctx->frame_worker->had_error)
    return update_error_state(ctx, &frame_worker_data->pbi->error);

  // Allow extra zero bytes after the frame end
  while (data_start < data_end) {
    const uint8_t marker = data_start[0];
    if (marker) break;
    ++data_start;
  }

  Av1DecodeReturn *data2 = (Av1DecodeReturn *)user_priv;
  data2->idx = -1;
  if (cm->cur_frame) {
    for (int i = 0; i < REF_FRAMES; ++i)
      if (cm->ref_frame_map[i] == cm->cur_frame) data2->idx = i;
  }
  data2->buf = data_start;
  data2->show_existing = cm->show_existing_frame;
  return res;
}